

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O0

bool basisu::unpack_bc1(void *pBlock_bits,color_rgba *pPixels,bool set_alpha)

{
  bool bVar1;
  uint32_t uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar3;
  byte in_DL;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RSI;
  bc1_block *in_RDI;
  uint32_t y_1;
  uint32_t y;
  bool used_punchthrough;
  uint32_t b1;
  uint32_t g1;
  uint32_t r1;
  uint32_t b0;
  uint32_t g0;
  uint32_t r0;
  color_rgba c [4];
  uint32_t h;
  uint32_t l;
  bc1_block *pBlock;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_stack_ffffffffffffff68;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_stack_ffffffffffffff70;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_68;
  uint local_5c;
  uint local_58;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_38;
  color_rgba cStack_34;
  color_rgba cStack_30;
  color_rgba cStack_2c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_28;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_24;
  bc1_block *local_20;
  byte local_11;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_10;
  
  local_11 = in_DL & 1;
  local_20 = in_RDI;
  local_10 = in_RSI;
  local_24 = (anon_union_4_2_6eba8969_for_color_rgba_0)bc1_block::get_low_color(in_RDI);
  local_28 = (anon_union_4_2_6eba8969_for_color_rgba_0)bc1_block::get_high_color(local_20);
  local_68 = &local_38;
  do {
    color_rgba::color_rgba((color_rgba *)&local_68->field_1);
    local_68 = local_68 + 1;
  } while (local_68 != &local_28);
  bc1_block::unpack_color((uint32_t)local_24,&local_3c,&local_40,&local_44);
  bc1_block::unpack_color((uint32_t)local_28,&local_48,&local_4c,&local_50);
  color_rgba::set_noclamp_rgba((color_rgba *)&local_38.field_1,local_3c,local_40,local_44,0xff);
  color_rgba::set_noclamp_rgba(&cStack_34,local_48,local_4c,local_50,0xff);
  bVar1 = (uint)local_24 <= (uint)local_28;
  if (bVar1) {
    color_rgba::set_noclamp_rgba
              (&cStack_30,local_3c + local_48 >> 1,local_40 + local_4c >> 1,local_44 + local_50 >> 1
               ,0xff);
    color_rgba::set_noclamp_rgba(&cStack_2c,0,0,0,0);
  }
  else {
    color_rgba::set_noclamp_rgba
              (&cStack_30,(local_3c * 2 + local_48) / 3,(local_40 * 2 + local_4c) / 3,
               (local_44 * 2 + local_50) / 3,0xff);
    color_rgba::set_noclamp_rgba
              (&cStack_2c,(local_48 * 2 + local_3c) / 3,(local_4c * 2 + local_40) / 3,
               (local_50 * 2 + local_44) / 3,0xff);
  }
  if ((local_11 & 1) == 0) {
    for (local_5c = 0; paVar3 = local_10, local_5c < 4; local_5c = local_5c + 1) {
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&(&local_38)[uVar2].field_1);
      in_stack_ffffffffffffff68 = local_10 + 1;
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      color_rgba::set_rgb((color_rgba *)&in_stack_ffffffffffffff68->field_1,
                          (color_rgba *)&(&local_38)[uVar2].field_1);
      in_stack_ffffffffffffff70 = local_10 + 2;
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      color_rgba::set_rgb((color_rgba *)&in_stack_ffffffffffffff70->field_1,
                          (color_rgba *)&(&local_38)[uVar2].field_1);
      paVar3 = local_10 + 3;
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      color_rgba::set_rgb((color_rgba *)&paVar3->field_1,(color_rgba *)&(&local_38)[uVar2].field_1);
      local_10 = local_10 + 4;
    }
  }
  else {
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      *local_10 = (&local_38)[uVar2];
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      local_10[1] = (&local_38)[uVar2];
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      local_10[2] = (&local_38)[uVar2];
      uVar2 = bc1_block::get_selector
                        ((bc1_block *)&in_stack_ffffffffffffff70->field_1,
                         (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (uint32_t)in_stack_ffffffffffffff68);
      local_10[3] = (&local_38)[uVar2];
      local_10 = local_10 + 4;
    }
  }
  return bVar1;
}

Assistant:

bool unpack_bc1(const void *pBlock_bits, color_rgba *pPixels, bool set_alpha)
	{
		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");

		const bc1_block *pBlock = static_cast<const bc1_block *>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color_rgba c[4];

		uint32_t r0, g0, b0, r1, g1, b1;
		bc1_block::unpack_color(l, r0, g0, b0);
		bc1_block::unpack_color(h, r1, g1, b1);

		c[0].set_noclamp_rgba(r0, g0, b0, 255);
		c[1].set_noclamp_rgba(r1, g1, b1, 255);

		bool used_punchthrough = false;

		if (l > h)
		{
			c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
			c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
		}
		else
		{
			c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pPixels += 4)
			{
				pPixels[0] = c[pBlock->get_selector(0, y)]; 
				pPixels[1] = c[pBlock->get_selector(1, y)]; 
				pPixels[2] = c[pBlock->get_selector(2, y)]; 
				pPixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pPixels += 4)
			{
				pPixels[0].set_rgb(c[pBlock->get_selector(0, y)]); 
				pPixels[1].set_rgb(c[pBlock->get_selector(1, y)]); 
				pPixels[2].set_rgb(c[pBlock->get_selector(2, y)]); 
				pPixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}